

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O2

void __thiscall vigra::BmpEncoder::setNumBands(BmpEncoder *this,uint bands)

{
  if (this->pimpl->finalized == true) {
    throw_precondition_error
              (false,"encoder settings were already finalized",
               "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx"
               ,0x425);
  }
  throw_precondition_error
            (bands == 3 || bands == 1,"bmp supports only rgb and grayscale images",
             "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/bmp.cxx",
             0x427);
  this->pimpl->grayscale = bands == 1;
  return;
}

Assistant:

void BmpEncoder::setNumBands( unsigned int bands )
{
    VIGRA_IMPEX_FINALIZED(pimpl->finalized);
    vigra_precondition( ( bands == 1 ) || ( bands == 3 ),
                        "bmp supports only rgb and grayscale images" );
    pimpl->grayscale = ( bands == 1 );
}